

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O2

string * google::protobuf::TestTempDir_abi_cxx11_(void)

{
  __pid_t x;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  AlphaNum *a;
  string *in_RDI;
  AlphaNum *in_R8;
  string_view contents;
  string result;
  LogMessage local_f0 [3];
  AlphaNum local_c0;
  AlphaNum local_90;
  tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_60;
  LogMessage local_58;
  string local_40;
  
  if (DAT_0054b6e0 == 0) {
    x = getpid();
    testing::TempDir_abi_cxx11_();
    local_f0[0].errno_saver_.saved_errno_ = local_58.errno_saver_.saved_errno_;
    local_f0[0]._4_4_ = local_58._4_4_;
    local_f0[0].data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )local_60.
                       super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                       ._M_head_impl;
    local_90.piece_ = absl::lts_20250127::NullSafeStringView("protobuf_tempdir.");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,x);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_40,(lts_20250127 *)local_f0,&local_90,&local_c0,in_R8);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::operator=
              ((string *)&(anonymous_namespace)::temp_dir_deleter_,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    File::DeleteRecursively
              ((string *)&(anonymous_namespace)::temp_dir_deleter_,(void *)0x0,(void *)0x0);
    iVar1 = mkdir((char *)(anonymous_namespace)::temp_dir_deleter_._M_head_impl,0x1ff);
    if (iVar1 != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
                 ,0x82,"mkdir(name_.c_str(), 0777) == 0");
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      local_90.piece_._M_len = (size_t)pcVar3;
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>
                (local_f0,(char **)&local_90);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_f0);
    }
    local_f0[0]._0_8_ = DAT_0054b6e0;
    local_f0[0].data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(anonymous_namespace)::temp_dir_deleter_._M_head_impl;
    local_90.piece_ = absl::lts_20250127::NullSafeStringView("/TEMP_DIR_FOR_PROTOBUF_TESTS");
    a = &local_90;
    absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_c0,(lts_20250127 *)local_f0,a,a);
    contents._M_str = (char *)&local_c0;
    contents._M_len = (size_t)"";
    File::WriteStringToFileOrDie((File *)0x0,contents,(string *)a);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)&(anonymous_namespace)::temp_dir_deleter_)
  ;
  return in_RDI;
}

Assistant:

std::string TestTempDir() { return temp_dir_deleter_.GetTempDir(); }